

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * get_rel_url_at_current_server(char *uri,mg_connection *conn)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t local_6c;
  char *local_68;
  char *portend;
  char *portbegin;
  char *hostend;
  char *hostbegin;
  int auth_domain_check_enabled;
  int i;
  unsigned_long port;
  size_t request_domain_len;
  size_t server_domain_len;
  char *server_domain;
  mg_connection *conn_local;
  char *uri_local;
  
  port = 0;
  _auth_domain_check_enabled = 0;
  hostend = (char *)0x0;
  portbegin = (char *)0x0;
  server_domain = (char *)conn;
  conn_local = (mg_connection *)uri;
  iVar2 = mg_strcasecmp(conn->dom_ctx->config[0x1f],"yes");
  hostbegin._0_4_ = (uint)((iVar2 != 0 ^ 0xffU) & 1);
  hostbegin._4_4_ = 0;
  do {
    if (abs_uri_protocols[hostbegin._4_4_].proto == (char *)0x0) {
LAB_0012dfa6:
      if (_auth_domain_check_enabled == 0) {
        uri_local = (char *)0x0;
      }
      else {
        if (*(short *)(server_domain + 0x8fc) == 10) {
          local_6c = *(uint16_t *)(server_domain + 0x8fe);
        }
        else {
          local_6c = *(uint16_t *)(server_domain + 0x8fe);
        }
        uVar1 = ntohs(local_6c);
        if (uVar1 == _auth_domain_check_enabled) {
          if ((uint)hostbegin != 0) {
            server_domain_len = *(undefined8 *)(*(long *)(server_domain + 0x8e8) + 0xf8);
            request_domain_len = strlen((char *)server_domain_len);
            if ((request_domain_len == 0) || (hostend == (char *)0x0)) {
              return (char *)0x0;
            }
            if ((port != request_domain_len) ||
               (iVar2 = memcmp((void *)server_domain_len,hostend,request_domain_len), iVar2 != 0)) {
              if (port < request_domain_len + 2) {
                return (char *)0x0;
              }
              if (hostend[(port - request_domain_len) + -1] != '.') {
                return (char *)0x0;
              }
              iVar2 = memcmp((void *)server_domain_len,hostend + (port - request_domain_len),
                             request_domain_len);
              if (iVar2 != 0) {
                return (char *)0x0;
              }
            }
          }
          uri_local = portbegin;
        }
        else {
          uri_local = (char *)0x0;
        }
      }
      return uri_local;
    }
    iVar2 = mg_strncasecmp((char *)conn_local,abs_uri_protocols[hostbegin._4_4_].proto,
                           abs_uri_protocols[hostbegin._4_4_].proto_len);
    if (iVar2 == 0) {
      hostend = (conn_local->request_info).remote_addr +
                (abs_uri_protocols[hostbegin._4_4_].proto_len - 0x48);
      portbegin = strchr(hostend,0x2f);
      if (portbegin == (char *)0x0) {
        return (char *)0x0;
      }
      portend = strchr(hostend,0x3a);
      if ((portend == (char *)0x0) || (portbegin < portend)) {
        _auth_domain_check_enabled = (ulong)abs_uri_protocols[hostbegin._4_4_].default_port;
        port = (long)portbegin - (long)hostend;
      }
      else {
        _auth_domain_check_enabled = strtoul(portend + 1,&local_68,10);
        if (((local_68 != portbegin) || (_auth_domain_check_enabled == 0)) ||
           (iVar2 = is_valid_port(_auth_domain_check_enabled), iVar2 == 0)) {
          return (char *)0x0;
        }
        port = (long)portend - (long)hostend;
      }
      goto LAB_0012dfa6;
    }
    hostbegin._4_4_ = hostbegin._4_4_ + 1;
  } while( true );
}

Assistant:

static const char *
get_rel_url_at_current_server(const char *uri, const struct mg_connection *conn)
{
	const char *server_domain;
	size_t server_domain_len;
	size_t request_domain_len = 0;
	unsigned long port = 0;
	int i, auth_domain_check_enabled;
	const char *hostbegin = NULL;
	const char *hostend = NULL;
	const char *portbegin;
	char *portend;

	auth_domain_check_enabled =
	    !mg_strcasecmp(conn->dom_ctx->config[ENABLE_AUTH_DOMAIN_CHECK], "yes");

	/* DNS is case insensitive, so use case insensitive string compare here
	 */
	for (i = 0; abs_uri_protocols[i].proto != NULL; i++) {
		if (mg_strncasecmp(uri,
		                   abs_uri_protocols[i].proto,
		                   abs_uri_protocols[i].proto_len)
		    == 0) {

			hostbegin = uri + abs_uri_protocols[i].proto_len;
			hostend = strchr(hostbegin, '/');
			if (!hostend) {
				return 0;
			}
			portbegin = strchr(hostbegin, ':');
			if ((!portbegin) || (portbegin > hostend)) {
				port = abs_uri_protocols[i].default_port;
				request_domain_len = (size_t)(hostend - hostbegin);
			} else {
				port = strtoul(portbegin + 1, &portend, 10);
				if ((portend != hostend) || (port <= 0)
				    || !is_valid_port(port)) {
					return 0;
				}
				request_domain_len = (size_t)(portbegin - hostbegin);
			}
			/* protocol found, port set */
			break;
		}
	}

	if (!port) {
		/* port remains 0 if the protocol is not found */
		return 0;
	}

	/* Check if the request is directed to a different server. */
	/* First check if the port is the same. */
	if (ntohs(USA_IN_PORT_UNSAFE(&conn->client.lsa)) != port) {
		/* Request is directed to a different port */
		return 0;
	}

	/* Finally check if the server corresponds to the authentication
	 * domain of the server (the server domain).
	 * Allow full matches (like http://mydomain.com/path/file.ext), and
	 * allow subdomain matches (like http://www.mydomain.com/path/file.ext),
	 * but do not allow substrings (like
	 * http://notmydomain.com/path/file.ext
	 * or http://mydomain.com.fake/path/file.ext).
	 */
	if (auth_domain_check_enabled) {
		server_domain = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
		server_domain_len = strlen(server_domain);
		if ((server_domain_len == 0) || (hostbegin == NULL)) {
			return 0;
		}
		if ((request_domain_len == server_domain_len)
		    && (!memcmp(server_domain, hostbegin, server_domain_len))) {
			/* Request is directed to this server - full name match. */
		} else {
			if (request_domain_len < (server_domain_len + 2)) {
				/* Request is directed to another server: The server name
				 * is longer than the request name.
				 * Drop this case here to avoid overflows in the
				 * following checks. */
				return 0;
			}
			if (hostbegin[request_domain_len - server_domain_len - 1] != '.') {
				/* Request is directed to another server: It could be a
				 * substring
				 * like notmyserver.com */
				return 0;
			}
			if (0
			    != memcmp(server_domain,
			              hostbegin + request_domain_len - server_domain_len,
			              server_domain_len)) {
				/* Request is directed to another server:
				 * The server name is different. */
				return 0;
			}
		}
	}

	return hostend;
}